

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

bool __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
FixEqualityResult<mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *c
          ,PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
           *prepro)

{
  ConType *this_00;
  double dVar1;
  double dVar2;
  BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *unaff_retaddr;
  PreprocessInfoStd bndsNType;
  double rhs;
  LinTerms *body;
  ConType *con;
  double in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  Type in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  this_00 = ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
            GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                           *)0x4e4416);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetBody(this_00);
  dVar1 = AlgConRhs<0>::rhs(&this_00->super_AlgConRhs<0>);
  BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ComputeBoundsAndType
            (unaff_retaddr,(LinTerms *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
            );
  dVar2 = PreprocessInfo<int>::lb((PreprocessInfo<int> *)&stack0xffffffffffffffb0);
  if ((dVar1 < dVar2) ||
     (dVar2 = PreprocessInfo<int>::ub((PreprocessInfo<int> *)&stack0xffffffffffffffb0),
     dVar2 < dVar1)) {
    PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
    ::narrow_result_bounds
              ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    bVar3 = true;
  }
  else {
    dVar2 = PreprocessInfo<int>::lb((PreprocessInfo<int> *)&stack0xffffffffffffffb0);
    if (dVar2 == dVar1) {
      dVar2 = PreprocessInfo<int>::ub((PreprocessInfo<int> *)&stack0xffffffffffffffb0);
      if ((dVar2 == dVar1) && (!NAN(dVar2) && !NAN(dVar1))) {
        PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
        ::narrow_result_bounds
                  ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        return true;
      }
    }
    if (in_stack_ffffffffffffffc0 == INTEGER) {
      AlgConRhs<0>::rhs(&this_00->super_AlgConRhs<0>);
      bVar3 = is_integer<double>(in_stack_ffffffffffffffb0);
      if (!bVar3) {
        PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
        ::narrow_result_bounds
                  ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        return true;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool FixEqualityResult(
      CondAlgCon& c, PreprocessInfo& prepro) {
    const auto& con = c.GetConstraint();
    const auto& body = con.GetBody();
    const auto rhs = con.rhs();
    auto bndsNType = MPD( ComputeBoundsAndType(body) );
    if (bndsNType.lb() > rhs || bndsNType.ub() < rhs) {
      prepro.narrow_result_bounds(0.0, 0.0);
      return true;
    }
    if (bndsNType.lb()==rhs && bndsNType.ub()==rhs) {
      prepro.narrow_result_bounds(1.0, 1.0);
      return true;
    }
    if (var::INTEGER==bndsNType.type_ &&
        !is_integer(con.rhs())) {
      prepro.narrow_result_bounds(0.0, 0.0);
      return true;
    }
    return false;
  }